

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

int Mop_ManMergeContainAll(Mop_Man_t *p,Vec_Wec_t *vGroups)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  Vec_Int_t *vGroup;
  int local_44;
  long local_40;
  
  if (vGroups->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    local_40 = 0x10;
    local_44 = 1;
    iVar4 = 0;
    do {
      vGroup = vGroups->pArray + lVar5;
      iVar1 = Mop_ManRemoveIdentical(p,vGroup);
      iVar4 = iVar1 + iVar4;
      lVar5 = lVar5 + 1;
      lVar3 = (long)vGroups->nSize;
      lVar6 = local_40;
      iVar1 = local_44;
      if (lVar5 < lVar3) {
        do {
          iVar2 = Mop_ManMergeContainTwo
                            (p,vGroup,(Vec_Int_t *)((long)&vGroups->pArray->nCap + lVar6));
          iVar4 = iVar4 + iVar2;
          lVar3 = (long)vGroups->nSize;
          iVar1 = iVar1 + 1;
          lVar6 = lVar6 + 0x10;
        } while (iVar1 < vGroups->nSize);
      }
      local_40 = local_40 + 0x10;
      local_44 = local_44 + 1;
    } while (lVar5 < lVar3);
  }
  return iVar4;
}

Assistant:

int Mop_ManMergeContainAll( Mop_Man_t * p, Vec_Wec_t * vGroups )
{
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, Count = 0;
    Vec_WecForEachLevel( vGroups, vGroup, i )
    {
        Count += Mop_ManRemoveIdentical( p, vGroup );
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            Count += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    }
    return Count;
}